

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O2

bool API::checkDelete(STMT *stmt,int pos)

{
  _Rb_tree_color _Var1;
  int iVar2;
  int iVar3;
  TableInfo *pTVar4;
  vector<condition,_std::allocator<condition>_> *this;
  bool bVar5;
  reference pvVar6;
  iterator iVar7;
  ostream *poVar8;
  ostream *poVar9;
  char *pcVar10;
  ulong __n;
  long lVar11;
  
  if (pos < 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"delete fail,table ");
    poVar9 = std::operator<<(poVar9,(string *)&stmt->tableName);
    pcVar10 = " does not exist";
LAB_0011efce:
    poVar9 = std::operator<<(poVar9,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar9);
    bVar5 = false;
  }
  else {
    pTVar4 = CM.TableInfoList.super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)pos];
    lVar11 = 0;
    for (__n = 0; this = stmt->c_list,
        __n < (ulong)(((long)(this->super__Vector_base<condition,_std::allocator<condition>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super__Vector_base<condition,_std::allocator<condition>_>).
                            _M_impl.super__Vector_impl_data._M_start) / 0x68); __n = __n + 1) {
      pvVar6 = std::vector<condition,_std::allocator<condition>_>::at(this,__n);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(pTVar4->getID)._M_t,&pvVar6->colunmName);
      if ((_Rb_tree_header *)iVar7._M_node == &(pTVar4->getID)._M_t._M_impl.super__Rb_tree_header) {
        poVar9 = std::operator<<((ostream *)&std::cout,"colunm ");
        pvVar6 = std::vector<condition,_std::allocator<condition>_>::at(stmt->c_list,__n);
        poVar9 = std::operator<<(poVar9,(string *)&pvVar6->colunmName);
        pcVar10 = "does not exist";
        goto LAB_0011efce;
      }
      _Var1 = iVar7._M_node[2]._M_color;
      pvVar6 = std::vector<condition,_std::allocator<condition>_>::at(stmt->c_list,__n);
      pvVar6->colunmID = _Var1;
      pvVar6 = std::vector<condition,_std::allocator<condition>_>::at(stmt->c_list,__n);
      iVar2 = pvVar6->type;
      iVar3 = (pTVar4->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)iVar7._M_node[2]._M_color];
      if ((iVar2 != iVar3) && (((iVar3 < iVar2 || (iVar2 < 0x1d4c1)) || (iVar3 < 0x1d4c1)))) {
        poVar9 = (ostream *)&std::cout;
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 ((long)&(((pTVar4->attributeName).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar11));
        poVar8 = std::operator<<(poVar8," type does not match");
        std::endl<char,std::char_traits<char>>(poVar8);
        poVar8 = std::operator<<((ostream *)&std::cout,"insert type is ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
        poVar8 = std::operator<<(poVar8," while check type is ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar10 = "error occured";
        goto LAB_0011efce;
      }
      lVar11 = lVar11 + 0x20;
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool API::checkDelete(STMT* stmt,int pos){
    if(pos < 0){
        std::cout<<"delete fail,table "<<stmt->tableName<<" does not exist"<<std::endl;
        return false;
    }
    TableInfo* info = CM.TableInfoList[pos];
    //增加id 增加类型检查
    bool error = false;
    for(int i = 0 ; i < stmt->c_list->size() ; i ++){
        //增加colunmid
        auto it = info->getID.find(stmt->c_list->at(i).colunmName);
        if(it==info->getID.end()){
            std::cout<<"colunm "<< stmt->c_list->at(i).colunmName << "does not exist"<<std::endl;
            return false;
        }
        else{
            stmt->c_list->at(i).colunmID = it->second;
        }
        //先检查类型
        int insertType = stmt->c_list->at(i).type;
        int checkType = info->type[it->second];
        if(insertType != checkType ){
            if(checkType > 120000 && insertType > 120000 && insertType <= checkType)continue;
            std::cout<<info->attributeName[i]<<" type does not match"<< std::endl;
            std::cout << "insert type is "<<insertType<<" while check type is "<<checkType<<std::endl;
            error = true;
        }
        if(error){
            std::cout<<"error occured"<<std::endl;
            return false;
        }
    }
    return true;
}